

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O1

void capnp::compiler::anon_unknown_0::attachDocComment(Builder statement,Array<kj::String> *comment)

{
  long lVar1;
  size_t sVar2;
  String *pSVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  ByteCount size;
  void *__src;
  long lVar8;
  Array<kj::String> *__range2;
  Builder builder;
  char *local_78;
  Fault local_70;
  DebugComparison<char_*&,_char_*> local_68;
  Builder local_40;
  long lVar7;
  
  if (comment->size_ == 0) {
    size = 0;
  }
  else {
    lVar8 = 0;
    lVar7 = 0;
    do {
      lVar1 = *(long *)((long)&(comment->ptr->content).size_ + lVar8);
      lVar7 = lVar7 + lVar1 + (ulong)(lVar1 == 0);
      size = (ByteCount)lVar7;
      lVar8 = lVar8 + 0x18;
    } while (comment->size_ * 0x18 != lVar8);
  }
  local_68.op.content.ptr = (char *)(statement._builder.pointers + 2);
  local_68.left = (char **)statement._builder.segment;
  local_68.right = (char *)statement._builder.capTable;
  capnp::_::PointerBuilder::initBlob<capnp::Text>(&local_40,(PointerBuilder *)&local_68,size);
  local_78 = local_40.content.ptr;
  sVar2 = comment->size_;
  if (sVar2 != 0) {
    pSVar3 = comment->ptr;
    lVar7 = 0;
    do {
      pvVar4 = *(void **)((long)&(pSVar3->content).size_ + lVar7);
      __src = pvVar4;
      if (pvVar4 != (void *)0x0) {
        __src = *(void **)((long)&(pSVar3->content).ptr + lVar7);
      }
      sVar5 = (long)pvVar4 - 1;
      if (pvVar4 == (void *)0x0) {
        sVar5 = 0;
      }
      memcpy(local_78,__src,sVar5);
      lVar8 = *(long *)((long)&(pSVar3->content).size_ + lVar7);
      sVar5 = lVar8 - 1;
      if (lVar8 == 0) {
        sVar5 = 0;
      }
      pcVar6 = local_78 + sVar5;
      local_78 = pcVar6 + 1;
      *pcVar6 = '\n';
      lVar7 = lVar7 + 0x18;
    } while (sVar2 * 0x18 != lVar7);
  }
  local_68.right = local_40.content.ptr + (local_40.content.size_ - 1);
  local_68.left = &local_78;
  local_68.op.content.ptr = " == ";
  local_68.result = local_78 == local_68.right;
  local_68.op.content.size_ = 5;
  if (!local_68.result) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/lexer.c++"
               ,0x6d,FAILED,"pos == builder.end()","_kjCondition,",&local_68);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  return;
}

Assistant:

void attachDocComment(Statement::Builder statement, kj::Array<kj::String>&& comment) {
  size_t size = 0;
  for (auto& line: comment) {
    size += line.size() + 1;  // include newline
  }
  Text::Builder builder = statement.initDocComment(size);
  char* pos = builder.begin();
  for (auto& line: comment) {
    memcpy(pos, line.begin(), line.size());
    pos += line.size();
    *pos++ = '\n';
  }
  KJ_ASSERT(pos == builder.end());
}